

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie_test.cpp
# Opt level: O2

void __thiscall unit_test::main(unit_test *this,string *param_1)

{
  cookie *pcVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
  *__x;
  ostream *poVar2;
  _Base_ptr p_Var3;
  _Self __tmp;
  allocator local_1b0 [32];
  allocator local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  cookies_type cookies;
  
  pcVar1 = (cookie *)cppcms::application::response();
  std::__cxx11::string::string(local_110,"normal",local_190);
  std::__cxx11::string::string(local_130,"token",local_1b0);
  cppcms::http::cookie::cookie((cookie *)&cookies,local_110,local_130);
  cppcms::http::response::set_cookie(pcVar1);
  cppcms::http::cookie::~cookie((cookie *)&cookies);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_110);
  pcVar1 = (cookie *)cppcms::application::response();
  std::__cxx11::string::string(local_150,"utf",local_190);
  std::__cxx11::string::string(local_170,anon_var_dwarf_4be9,local_1b0);
  cppcms::http::cookie::cookie((cookie *)&cookies,local_150,local_170);
  cppcms::http::response::set_cookie(pcVar1);
  cppcms::http::cookie::~cookie((cookie *)&cookies);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_150);
  cppcms::application::request();
  __x = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
         *)cppcms::http::request::cookies_abi_cxx11_();
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
  ::_Rb_tree(&cookies._M_t,__x);
  for (p_Var3 = cookies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &cookies._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    cppcms::application::response();
    poVar2 = (ostream *)cppcms::http::response::out();
    cppcms::http::cookie::name_abi_cxx11_();
    poVar2 = std::operator<<(poVar2,(string *)local_190);
    poVar2 = std::operator<<(poVar2,':');
    cppcms::http::cookie::value_abi_cxx11_();
    poVar2 = std::operator<<(poVar2,(string *)local_1b0);
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)local_1b0);
    std::__cxx11::string::~string((string *)local_190);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
  ::~_Rb_tree(&cookies._M_t);
  return;
}

Assistant:

virtual void main(std::string /*test*/)
	{
		response().set_cookie(cppcms::http::cookie("normal","token"));
		response().set_cookie(cppcms::http::cookie("utf","\xD7\xA9\xD7\x9C\xD7\x95\xD7\x9D \xD7\xA9\xD7\x9C\xD7\x95\xD7\x9D"));
		typedef cppcms::http::request::cookies_type cookies_type;
		cookies_type cookies=request().cookies();
		for(cookies_type::iterator cookie=cookies.begin();cookie!=cookies.end();cookie++) {
			response().out()<<cookie->second.name()<<':'<<cookie->second.value()<<'\n';
		}
	}